

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

TreeNode * anon_unknown.dwarf_84a1::add_exp(void)

{
  TreeNode *pTVar1;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  TreeNode *local_10;
  TreeNode *t;
  
  local_10 = newNode(Void,lineno);
  if (local_10 != (TreeNode *)0x0) {
    pTVar1 = mul_exp();
    local_10->child[0] = pTVar1;
  }
  if ((anonymous_namespace)::token == 0x1a) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"",&local_31);
    match(TK_PLUS,0,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_10->nodetype = PLUS_EXP;
    pTVar1 = add_exp();
    local_10->child[1] = pTVar1;
  }
  else if ((anonymous_namespace)::token == 0x1b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"",&local_69);
    match(TK_SUB,0,(string *)local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_10->nodetype = SUB_EXP;
    pTVar1 = add_exp();
    local_10->child[1] = pTVar1;
  }
  else {
    local_10 = local_10->child[0];
  }
  return local_10;
}

Assistant:

TreeNode* add_exp(){
        TreeNode *t = newNode(Void, lineno);
        if(t != nullptr){
            t->child[0] = mul_exp();
        }
        switch(token){
            case TK_PLUS:
                match(TK_PLUS);
                t->nodetype = PLUS_EXP;
                t->child[1] = add_exp();
                break;
            case TK_SUB:
                match(TK_SUB);
                t->nodetype = SUB_EXP;
                t->child[1] = add_exp();
                break;
            default:
                t = t->child[0];
                break;
        }
        return t;
    }